

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool __thiscall
slang::ast::Expression::isImplicitlyAssignableTo
          (Expression *this,Compilation *compilation,Type *targetType)

{
  bool bVar1;
  undefined8 in_RSI;
  Type *unaff_retaddr;
  Type *in_stack_00000008;
  Compilation *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::CompilationFlags> flags;
  Type *in_stack_ffffffffffffffb8;
  bool local_3a;
  bool local_39;
  bitmask<slang::ast::CompilationFlags> local_28;
  bitmask<slang::ast::CompilationFlags> local_24 [4];
  underlying_type uStack_14;
  bool local_1;
  
  uStack_14 = (underlying_type)((ulong)in_RSI >> 0x20);
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x98cca0);
  bVar1 = Type::isAssignmentCompatible(in_stack_00000008,unaff_retaddr);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = Type::isString((Type *)0x98ccc7);
    if (((bVar1) || (bVar1 = Type::isByteArray(in_stack_ffffffffffffffb8), bVar1)) &&
       (bVar1 = isImplicitString((Expression *)targetType), bVar1)) {
      local_1 = true;
    }
    else {
      bVar1 = Type::isEnum((Type *)0x98ccff);
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_14f2d17::isSameEnum
                          ((Expression *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        local_39 = true;
        if (!bVar1) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x98cd32);
          bVar1 = Type::isIntegral(in_stack_ffffffffffffffb0);
          flags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
          local_3a = false;
          if (bVar1) {
            bitmask<slang::ast::CompilationFlags>::bitmask(local_24,RelaxEnumConversions);
            local_3a = Compilation::hasFlag(in_stack_ffffffffffffffa8,flags);
          }
          local_39 = local_3a;
        }
        local_1 = local_39;
      }
      else {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x98cd96);
        bVar1 = Type::isString((Type *)0x98cd9e);
        if ((bVar1) && (bVar1 = Type::isIntegral(in_stack_ffffffffffffffb0), bVar1)) {
          bitmask<slang::ast::CompilationFlags>::bitmask(&local_28,RelaxStringConversions);
          bVar1 = Compilation::hasFlag
                            (in_stack_ffffffffffffffa8,
                             (bitmask<slang::ast::CompilationFlags>)uStack_14);
          if (bVar1) {
            return true;
          }
        }
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool Expression::isImplicitlyAssignableTo(Compilation& compilation, const Type& targetType) const {
    if (targetType.isAssignmentCompatible(*type))
        return true;

    // String literals have a type of integer, but are allowed to implicitly convert to the
    // string type.
    if ((targetType.isString() || targetType.isByteArray()) && isImplicitString())
        return true;

    if (targetType.isEnum()) {
        return isSameEnum(*this, targetType) ||
               (type->isIntegral() && compilation.hasFlag(CompilationFlags::RelaxEnumConversions));
    }

    if (type->isString() && targetType.isIntegral() &&
        compilation.hasFlag(CompilationFlags::RelaxStringConversions)) {
        return true;
    }

    return false;
}